

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O2

void __thiscall
facenet::Inception_resnet_C(facenet *this,pBox *input,pBox *output,string *filepath,float scale)

{
  pBox *pbox;
  pBox *pbox_00;
  pBox *pbox_01;
  pBox *pbox_02;
  pBox *pbox_03;
  pBox *pbox_04;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  Weight *weight_03;
  Weight *weight_04;
  BN *var;
  BN *mean;
  BN *beta;
  BN *var_00;
  BN *mean_00;
  BN *beta_00;
  BN *bn;
  BN *bn_00;
  BN *bn_01;
  BN *bn_02;
  BN *bn_03;
  BN *bn_04;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  string local_198;
  mydataFmt *local_178;
  mydataFmt *local_170;
  mydataFmt *local_168;
  mydataFmt *local_160;
  mydataFmt *local_158;
  mydataFmt *local_150;
  mydataFmt *local_148;
  mydataFmt *local_140;
  mydataFmt *local_138;
  mydataFmt *local_130;
  mydataFmt *local_128;
  mydataFmt *local_120;
  mydataFmt *local_118;
  mydataFmt *local_110;
  mydataFmt *local_108;
  mydataFmt *local_100;
  mydataFmt *local_f8;
  mydataFmt *pmStack_f0;
  mydataFmt *local_e8;
  mydataFmt *pmStack_e0;
  long dataNumber [20];
  
  pbox = (pBox *)operator_new(0x38);
  (pbox->super_String)._M_dataplus._M_p = (pointer)&(pbox->super_String).field_2;
  (pbox->super_String)._M_string_length = 0;
  (pbox->super_String).field_2._M_local_buf[0] = '\0';
  pbox_00 = (pBox *)operator_new(0x38);
  (pbox_00->super_String)._M_dataplus._M_p = (pointer)&(pbox_00->super_String).field_2;
  (pbox_00->super_String)._M_string_length = 0;
  (pbox_00->super_String).field_2._M_local_buf[0] = '\0';
  pbox_01 = (pBox *)operator_new(0x38);
  (pbox_01->super_String)._M_dataplus._M_p = (pointer)&(pbox_01->super_String).field_2;
  (pbox_01->super_String)._M_string_length = 0;
  (pbox_01->super_String).field_2._M_local_buf[0] = '\0';
  pbox_02 = (pBox *)operator_new(0x38);
  (pbox_02->super_String)._M_dataplus._M_p = (pointer)&(pbox_02->super_String).field_2;
  (pbox_02->super_String)._M_string_length = 0;
  (pbox_02->super_String).field_2._M_local_buf[0] = '\0';
  pbox_03 = (pBox *)operator_new(0x38);
  (pbox_03->super_String)._M_dataplus._M_p = (pointer)&(pbox_03->super_String).field_2;
  (pbox_03->super_String)._M_string_length = 0;
  (pbox_03->super_String).field_2._M_local_buf[0] = '\0';
  pbox_04 = (pBox *)operator_new(0x38);
  (pbox_04->super_String)._M_dataplus._M_p = (pointer)&(pbox_04->super_String).field_2;
  (pbox_04->super_String)._M_string_length = 0;
  (pbox_04->super_String).field_2._M_local_buf[0] = '\0';
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  weight_03 = (Weight *)operator_new(0x38);
  weight_04 = (Weight *)operator_new(0x38);
  var = (BN *)operator_new(0x10);
  mean = (BN *)operator_new(0x10);
  beta = (BN *)operator_new(0x10);
  var_00 = (BN *)operator_new(0x10);
  mean_00 = (BN *)operator_new(0x10);
  beta_00 = (BN *)operator_new(0x10);
  bn = (BN *)operator_new(0x10);
  bn_00 = (BN *)operator_new(0x10);
  bn_01 = (BN *)operator_new(0x10);
  bn_02 = (BN *)operator_new(0x10);
  bn_03 = (BN *)operator_new(0x10);
  bn_04 = (BN *)operator_new(0x10);
  lVar1 = ConvAndFcInit(weight,0xc0,0x700,1,1,0,0,0,0,0);
  BatchNormInit(beta,mean,var,0xc0);
  lVar2 = ConvAndFcInit(weight_00,0xc0,0x700,1,1,0,0,0,0,0);
  BatchNormInit(beta_00,mean_00,var_00,0xc0);
  lVar3 = ConvAndFcInit(weight_01,0xc0,0xc0,0,1,-1,3,1,1,0);
  BatchNormInit(bn_01,bn_00,bn,0xc0);
  lVar4 = ConvAndFcInit(weight_02,0xc0,0xc0,0,1,-1,1,3,0,1);
  BatchNormInit(bn_04,bn_03,bn_02,0xc0);
  lVar5 = ConvAndFcInit(weight_03,0x700,0x180,1,1,0,0,0,0,0);
  dataNumber[0x12] = ConvAndFcInit(weight_04,0x700,0,0,0,0,0,0,0,0);
  dataNumber[1] = 0xc0;
  dataNumber[2] = 0xc0;
  dataNumber[3] = 0xc0;
  dataNumber[5] = 0xc0;
  dataNumber[6] = 0xc0;
  dataNumber[7] = 0xc0;
  dataNumber[9] = 0xc0;
  dataNumber[10] = 0xc0;
  dataNumber[0xb] = 0xc0;
  dataNumber[0xd] = 0xc0;
  dataNumber[0xe] = 0xc0;
  dataNumber[0xf] = 0xc0;
  dataNumber[0x11] = 0x700;
  local_178 = weight->pdata;
  local_170 = beta->pdata;
  local_168 = mean->pdata;
  local_160 = var->pdata;
  local_158 = weight_00->pdata;
  local_150 = beta_00->pdata;
  local_148 = mean_00->pdata;
  local_140 = var_00->pdata;
  local_138 = weight_01->pdata;
  local_130 = bn_01->pdata;
  local_128 = bn_00->pdata;
  local_120 = bn->pdata;
  local_118 = weight_02->pdata;
  local_110 = bn_04->pdata;
  local_108 = bn_03->pdata;
  local_100 = bn_02->pdata;
  dataNumber[0x13] = 0;
  local_f8 = weight_03->pdata;
  pmStack_f0 = weight_03->pbias;
  local_e8 = weight_04->pdata;
  pmStack_e0 = weight_04->pbias;
  dataNumber[0] = lVar1;
  dataNumber[4] = lVar2;
  dataNumber[8] = lVar3;
  dataNumber[0xc] = lVar4;
  dataNumber[0x10] = lVar5;
  std::__cxx11::string::string((string *)&local_198,(string *)filepath);
  readData(&local_198,dataNumber,&local_178,0x14);
  std::__cxx11::string::~string((string *)&local_198);
  convolutionInit(weight,input,pbox);
  convolution(weight,input,pbox);
  BatchNorm(pbox,beta,mean,var);
  relu(pbox,weight->pbias);
  convolutionInit(weight_00,input,pbox_00);
  convolution(weight_00,input,pbox_00);
  BatchNorm(pbox_00,beta_00,mean_00,var_00);
  relu(pbox_00,weight_00->pbias);
  convolutionInit(weight_01,pbox_00,pbox_01);
  convolution(weight_01,pbox_00,pbox_01);
  BatchNorm(pbox_01,bn_01,bn_00,bn);
  relu(pbox_01,weight_01->pbias);
  convolutionInit(weight_02,pbox_01,pbox_02);
  convolution(weight_02,pbox_01,pbox_02);
  BatchNorm(pbox_02,bn_04,bn_03,bn_02);
  relu(pbox_02,weight_02->pbias);
  conv_mergeInit(pbox_03,pbox,pbox_02,(pBox *)0x0,(pBox *)0x0);
  conv_merge(pbox_03,pbox,pbox_02,(pBox *)0x0,(pBox *)0x0);
  convolutionInit(weight_03,pbox_03,pbox_04);
  convolution(weight_03,pbox_03,pbox_04);
  addbias(pbox_04,weight_03->pbias);
  mulandaddInit(input,pbox_04,output);
  mulandadd(input,pbox_04,output,scale);
  relu(output,weight_04->pbias);
  freepBox(pbox);
  freepBox(pbox_00);
  freepBox(pbox_01);
  freepBox(pbox_02);
  freepBox(pbox_03);
  freepBox(pbox_04);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freeWeight(weight_03);
  freeWeight(weight_04);
  freeBN(var);
  freeBN(mean);
  freeBN(beta);
  freeBN(var_00);
  freeBN(mean_00);
  freeBN(beta_00);
  freeBN(bn);
  freeBN(bn_00);
  freeBN(bn_01);
  freeBN(bn_02);
  freeBN(bn_03);
  freeBN(bn_04);
  return;
}

Assistant:

void facenet::Inception_resnet_C(pBox *input, pBox *output, string filepath, float scale) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;
    pBox *conv5_out = new pBox;
    pBox *conv6_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;
    struct Weight *conv5_wb = new Weight;
    struct Weight *conv6_wb = new Weight;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;
    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;
    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;
    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 192, 1792, 1, 1, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 192);
    long conv2 = ConvAndFcInit(conv2_wb, 192, 1792, 1, 1, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 192);
    long conv3 = ConvAndFcInit(conv3_wb, 192, 192, 0, 1, -1, 3, 1, 1, 0);
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 192);
    long conv4 = ConvAndFcInit(conv4_wb, 192, 192, 0, 1, -1, 1, 3, 0, 1);
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 192);

    long conv5 = ConvAndFcInit(conv5_wb, 1792, 384, 1, 1, 0);

    long conv6 = ConvAndFcInit(conv6_wb, 1792, 0, 0, 0, 0);

    long dataNumber[20] = {conv1, 192, 192, 192, conv2, 192, 192, 192, conv3, 192, 192, 192, conv4, 192, 192, 192,
                           conv5, 1792, conv6, 0};


//    mydataFmt *pointTeam[20] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata, \
//                            conv5_wb->pdata, conv5_wb->pbias, \
//                            conv6_wb->pdata, conv6_wb->pbias};
    mydataFmt *pointTeam[20] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata, \
                            conv5_wb->pdata, conv5_wb->pbias, \
                            conv6_wb->pdata, conv6_wb->pbias};

//    string filename = "../model_128/Repeat_2_list.txt";
//    int length = sizeof(dataNumber) / sizeof(*dataNumber);
    readData(filepath, dataNumber, pointTeam, 20);

    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 8 x 8 x 192
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, input, conv2_out);
    //conv2 8 x 8 x 192
    convolution(conv2_wb, input, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
    relu(conv2_out, conv2_wb->pbias);

    convolutionInit(conv3_wb, conv2_out, conv3_out);
    //conv3 8 x 8 x 192
    convolution(conv3_wb, conv2_out, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
    relu(conv3_out, conv3_wb->pbias);

    convolutionInit(conv4_wb, conv3_out, conv4_out);
    //conv4 8 x 8 x 192
    convolution(conv4_wb, conv3_out, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);

    conv_mergeInit(conv5_out, conv1_out, conv4_out);
    // 8*8*384
    conv_merge(conv5_out, conv1_out, conv4_out);

    convolutionInit(conv5_wb, conv5_out, conv6_out);
    //conv5 8 x 8 x 1792
    convolution(conv5_wb, conv5_out, conv6_out);
    addbias(conv6_out, conv5_wb->pbias);

    mulandaddInit(input, conv6_out, output);
    mulandadd(input, conv6_out, output, scale);
    relu(output, conv6_wb->pbias);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);
    freepBox(conv5_out);
    freepBox(conv6_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);
    freeWeight(conv5_wb);
    freeWeight(conv6_wb);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);
    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);
    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);
    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);
}